

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void ary::fillPolygon(Mat *image,
                     vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *points,
                     Scalar *value)

{
  Point_<float> PVar1;
  pointer pPVar2;
  long lVar3;
  long lVar4;
  Point_<int> PVar5;
  int mask_npoints;
  Point *mask_points_ptr;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  undefined8 local_40;
  undefined4 local_38 [2];
  Mat *local_30;
  undefined8 local_28;
  
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&mask_points,
             (long)(points->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(points->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_38);
  pPVar2 = (points->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(points->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3;
  mask_npoints = (int)lVar3;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    PVar1 = pPVar2[lVar4];
    PVar5.x = (int)PVar1.x;
    PVar5.y = (int)PVar1.y;
    mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = PVar5;
  }
  local_28 = 0;
  mask_points_ptr =
       mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38[0] = 0x3010000;
  local_40 = 0;
  local_30 = image;
  cv::fillPoly(local_38,&mask_points_ptr,&mask_npoints,1,value,8,0,&local_40);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  return;
}

Assistant:

void fillPolygon(Mat& image, const vector<Point2f>& points, Scalar value) {

	vector<Point> mask_points(points.size());
	int mask_npoints = points.size();
	for (int i = 0; i < points.size(); i++) {
		mask_points[i] = Point(points[i].x, points[i].y);
	}
	const Point* mask_points_ptr = &(mask_points[0]);
	fillPoly(image, &mask_points_ptr, &mask_npoints, 1, value);

}